

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O3

uint32_t VP8LPredictor13_C(uint32_t *left,uint32_t *top)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = top[-1];
  uVar3 = (*top & *left) + ((*top ^ *left) >> 1 & 0x7f7f7f7f);
  uVar4 = (uVar3 >> 0x18) - (uVar6 >> 0x18);
  uVar5 = ((int)(short)((short)((uVar4 & 0xffff) >> 0xf) + (short)uVar4) >> 1) + (uVar3 >> 0x18);
  uVar4 = ~uVar5 >> 0x18;
  if (uVar5 < 0x100) {
    uVar4 = uVar5;
  }
  uVar1 = uVar3 >> 0x10 & 0xff;
  uVar5 = uVar1 - (uVar6 >> 0x10 & 0xff);
  uVar1 = ((int)(short)((short)((uVar5 & 0xffff) >> 0xf) + (short)uVar5) >> 1) + uVar1;
  uVar5 = ~uVar1 >> 0x18;
  if (uVar1 < 0x100) {
    uVar5 = uVar1;
  }
  uVar2 = uVar3 >> 8 & 0xff;
  uVar1 = uVar2 - (uVar6 >> 8 & 0xff);
  uVar2 = ((int)(short)((short)((uVar1 & 0xffff) >> 0xf) + (short)uVar1) >> 1) + uVar2;
  uVar1 = ~uVar2 >> 0x18;
  if (uVar2 < 0x100) {
    uVar1 = uVar2;
  }
  uVar6 = (uVar3 & 0xff) - (uVar6 & 0xff);
  uVar3 = ((int)(short)((short)((uVar6 & 0xffff) >> 0xf) + (short)uVar6) >> 1) + (uVar3 & 0xff);
  uVar6 = ~uVar3 >> 0x18;
  if (uVar3 < 0x100) {
    uVar6 = uVar3;
  }
  return uVar1 * 0x100 + uVar5 * 0x10000 + uVar4 * 0x1000000 + uVar6;
}

Assistant:

uint32_t VP8LPredictor13_C(const uint32_t* const left,
                           const uint32_t* const top) {
  const uint32_t pred = ClampedAddSubtractHalf(*left, top[0], top[-1]);
  return pred;
}